

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sockets.cpp
# Opt level: O2

void __thiscall TcpSocket::TcpSocket(TcpSocket *this,addrinfo *host)

{
  int iVar1;
  int enable;
  string local_1c0;
  stringstream stream;
  ostream local_190 [376];
  
  Socket::Socket(&this->super_Socket,host,1);
  enable = 0;
  iVar1 = setsockopt((this->super_Socket).m_Socket,6,1,&enable,4);
  if (iVar1 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    std::operator<<(local_190,"Enabling TCP_NODELAY failed");
    std::__cxx11::stringbuf::str();
    Logger::Log(2,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  }
  return;
}

Assistant:

TcpSocket::TcpSocket(const struct addrinfo* const host)
    : Socket(host, SOCK_STREAM)
{
    // AdsDll.lib seems to use TCP_NODELAY, we use it to be compatible
    const int enable = 0;
    if (setsockopt(m_Socket, IPPROTO_TCP, TCP_NODELAY, (const char*)&enable, sizeof(enable))) {
        LOG_WARN("Enabling TCP_NODELAY failed");
    }
}